

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_dictionary_unittest.cc
# Opt level: O2

void anon_unknown.dwarf_4cac::Test_TemplateDictionary_IsHiddenSectionDefault::Run(void)

{
  TemplateString TVar1;
  bool bVar2;
  char *pcVar3;
  TemplateDictionaryPeer peer;
  TemplateString local_c0;
  TemplateString local_a0;
  TemplateDictionary dict;
  
  ctemplate::TemplateString::TemplateString(&local_c0,"dict");
  ctemplate::TemplateDictionary::TemplateDictionary(&dict,&local_c0,(UnsafeArena *)0x0);
  peer.dict_ = &dict;
  ctemplate::TemplateString::TemplateString(&local_c0,"UNDEFINED");
  bVar2 = ctemplate::TemplateDictionaryPeer::IsHiddenSection(&peer,&local_c0);
  if (bVar2) {
    ctemplate::TemplateString::TemplateString(&local_c0,"UNDEFINED");
    bVar2 = ctemplate::TemplateDictionaryPeer::IsUnhiddenSection(&peer,&local_c0);
    if (bVar2) {
      pcVar3 = "!(peer.IsUnhiddenSection(\"UNDEFINED\"))";
    }
    else {
      ctemplate::TemplateString::TemplateString(&local_a0,"VISIBLE");
      TVar1.length_ = local_a0.length_;
      TVar1.ptr_ = local_a0.ptr_;
      TVar1.is_immutable_ = local_a0.is_immutable_;
      TVar1._17_7_ = local_a0._17_7_;
      TVar1.id_ = local_a0.id_;
      ctemplate::TemplateDictionary::ShowSection(TVar1);
      ctemplate::TemplateString::TemplateString(&local_c0,"VISIBLE");
      bVar2 = ctemplate::TemplateDictionaryPeer::IsHiddenSection(&peer,&local_c0);
      if (bVar2) {
        pcVar3 = "!(peer.IsHiddenSection(\"VISIBLE\"))";
      }
      else {
        ctemplate::TemplateString::TemplateString(&local_c0,"VISIBLE");
        bVar2 = ctemplate::TemplateDictionaryPeer::IsUnhiddenSection(&peer,&local_c0);
        if (bVar2) {
          ctemplate::TemplateDictionary::~TemplateDictionary(&dict);
          return;
        }
        pcVar3 = "peer.IsUnhiddenSection(\"VISIBLE\")";
      }
    }
  }
  else {
    pcVar3 = "peer.IsHiddenSection(\"UNDEFINED\")";
  }
  fprintf(_stderr,"Check failed: %s\n",pcVar3);
  exit(1);
}

Assistant:

TEST(TemplateDictionary, IsHiddenSectionDefault) {
  TemplateDictionary dict("dict");
  TemplateDictionaryPeer peer(&dict);
  EXPECT_TRUE(peer.IsHiddenSection("UNDEFINED"));
  EXPECT_FALSE(peer.IsUnhiddenSection("UNDEFINED"));
  dict.ShowSection("VISIBLE");
  EXPECT_FALSE(peer.IsHiddenSection("VISIBLE"));
  EXPECT_TRUE(peer.IsUnhiddenSection("VISIBLE"));
}